

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O3

WOPNFile * WOPN_LoadBankFromMem(void *mem,size_t length,int *error)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  WOPNFile *file;
  WOPNBank **ppWVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ushort melodic_banks;
  ulong uVar10;
  ulong uVar11;
  ushort version;
  WOPNBank *pWVar12;
  uint8_t *cursor;
  bool bVar13;
  WOPNBank *local_48;
  WOPNBank *apWStack_40 [2];
  
  if (mem == (void *)0x0) {
    iVar4 = 6;
    goto LAB_00160fb1;
  }
  if (10 < length) {
    if (*(long *)((long)mem + 3) == 0x4b4e41422d324e && *mem == 0x41422d324e504f57) {
      version = 1;
      lVar9 = -0xb;
      lVar7 = 0xb;
    }
    else {
      if (*(long *)((long)mem + 3) != 0x4b4e32422d324e || *mem != 0x32422d324e504f57) {
        iVar4 = 1;
        goto LAB_00160fb1;
      }
      if (length - 0xb < 2) goto LAB_00160d0c;
      version = *(ushort *)((long)mem + 0xb);
      if (2 < version) {
        iVar4 = 4;
        goto LAB_00160fb1;
      }
      lVar9 = -0xd;
      lVar7 = 0xd;
    }
    if (4 < lVar9 + length) {
      bVar1 = *(byte *)((long)mem + lVar7 + 4);
      uVar2 = *(ushort *)((long)mem + lVar7 + 2);
      melodic_banks = *(ushort *)((long)mem + lVar7) << 8 | *(ushort *)((long)mem + lVar7) >> 8;
      uVar2 = uVar2 << 8 | uVar2 >> 8;
      file = WOPN_Init(melodic_banks,uVar2);
      if (file == (WOPNFile *)0x0) {
        iVar4 = 5;
      }
      else {
        cursor = (uint8_t *)((long)mem + lVar7 + 5);
        uVar8 = (lVar9 + length) - 5;
        file->version = version;
        file->lfo_freq = bVar1 & 0xf;
        if (version < 2) {
          file->volume_model = '\0';
          local_48 = file->banks_melodic;
          apWStack_40[0] = file->banks_percussive;
          uVar3 = 0x41;
        }
        else {
          file->chip_type = bVar1 >> 4 & 1;
          file->volume_model = '\0';
          ppWVar5 = &local_48;
          local_48 = file->banks_melodic;
          apWStack_40[0] = file->banks_percussive;
          bVar13 = true;
          uVar3 = melodic_banks;
          do {
            bVar6 = bVar13;
            if (uVar3 != 0) {
              lVar7 = 0;
              do {
                bVar13 = uVar8 < 0x22;
                uVar8 = uVar8 - 0x22;
                if (bVar13) goto LAB_00160f9d;
                pWVar12 = *ppWVar5;
                strncpy(pWVar12->bank_name + lVar7,(char *)cursor,0x20);
                pWVar12->bank_name[lVar7 + 0x20] = '\0';
                pWVar12->ins[0].inst_name[lVar7 + -3] = cursor[0x20];
                pWVar12->ins[0].inst_name[lVar7 + -2] = cursor[0x21];
                cursor = cursor + 0x22;
                lVar7 = lVar7 + 0x2424;
              } while ((ulong)uVar3 * 0x2424 - lVar7 != 0);
            }
            ppWVar5 = apWStack_40;
            bVar13 = false;
            uVar3 = uVar2;
          } while (bVar6);
          uVar3 = 0x45;
        }
        ppWVar5 = &local_48;
        bVar13 = true;
        while (uVar10 = (ulong)melodic_banks, uVar10 * (ulong)uVar3 * 0x80 <= uVar8) {
          if (uVar10 != 0) {
            pWVar12 = *ppWVar5;
            uVar11 = 0;
            do {
              lVar7 = 0x24;
              do {
                WOPN_parseInstrument
                          ((WOPNInstrument *)(pWVar12->bank_name + lVar7),cursor,version,'\x01');
                cursor = cursor + uVar3;
                lVar7 = lVar7 + 0x48;
              } while (lVar7 != 0x2424);
              uVar8 = uVar8 + (ulong)uVar3 * -0x80;
              uVar11 = uVar11 + 1;
              pWVar12 = pWVar12 + 1;
            } while (uVar11 != uVar10);
          }
          ppWVar5 = apWStack_40;
          bVar6 = !bVar13;
          bVar13 = false;
          melodic_banks = uVar2;
          if (bVar6) {
            return file;
          }
        }
LAB_00160f9d:
        WOPN_Free(file);
        iVar4 = 2;
      }
      goto LAB_00160fb1;
    }
  }
LAB_00160d0c:
  iVar4 = 2;
LAB_00160fb1:
  if (error != (int *)0x0) {
    *error = iVar4;
  }
  return (WOPNFile *)0x0;
}

Assistant:

WOPNFile *WOPN_LoadBankFromMem(void *mem, size_t length, int *error)
{
    WOPNFile *outFile = NULL;
    uint16_t i = 0, j = 0, k = 0;
    uint16_t version = 0;
    uint16_t count_melodic_banks     = 1;
    uint16_t count_percussive_banks   = 1;
    uint8_t *cursor = (uint8_t *)mem;

    WOPNBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

#define SET_ERROR(err) \
{\
    WOPN_Free(outFile);\
    if(error)\
    {\
        *error = err;\
    }\
}

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(!cursor)
    {
        SET_ERROR(WOPN_ERR_NULL_POINTER);
        return NULL;
    }

    {/* Magic number */
        if(length < 11)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        if(memcmp(cursor, wopn2_magic1, 11) == 0)
        {
            version = 1;
        }
        else if(memcmp(cursor, wopn2_magic2, 11) != 0)
        {
            SET_ERROR(WOPN_ERR_BAD_MAGIC);
            return NULL;
        }
        GO_FORWARD(11);
    }

    if (version == 0)
    {/* Version code */
        if(length < 2)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        version = toUint16LE(cursor);
        if(version > wopn_latest_version)
        {
            SET_ERROR(WOPN_ERR_NEWER_VERSION);
            return NULL;
        }
        GO_FORWARD(2);
    }

    {/* Header of WOPN */
        uint8_t head[5];
        if(length < 5)
        {
            SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
            return NULL;
        }
        memcpy(head, cursor, 5);
        count_melodic_banks = toUint16BE(head);
        count_percussive_banks = toUint16BE(head + 2);
        GO_FORWARD(5);

        outFile = WOPN_Init(count_melodic_banks, count_percussive_banks);
        if(!outFile)
        {
            SET_ERROR(WOPN_ERR_OUT_OF_MEMORY);
            return NULL;
        }

        outFile->version      = version;
        outFile->lfo_freq     = head[4] & 0xf;
        if(version >= 2)
            outFile->chip_type = (head[4] >> 4) & 1;
        outFile->volume_model = 0;
    }

    bankslots_sizes[0] = count_melodic_banks;
    bankslots[0] = outFile->banks_melodic;
    bankslots_sizes[1] = count_percussive_banks;
    bankslots[1] = outFile->banks_percussive;

    if(version >= 2) /* Bank names and LSB/MSB titles */
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                {
                    SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                    return NULL;
                }
                strncpy(bankslots[i][j].bank_name, (const char*)cursor, 32);
                bankslots[i][j].bank_name[32] = '\0';
                bankslots[i][j].bank_midi_lsb = cursor[32];
                bankslots[i][j].bank_midi_msb = cursor[33];
                GO_FORWARD(34);
            }
        }
    }

    {/* Read instruments data */
        uint16_t insSize = 0;
        if(version > 1)
            insSize = WOPN_INST_SIZE_V2;
        else
            insSize = WOPN_INST_SIZE_V1;
        for(i = 0; i < 2; i++)
        {
            if(length < (insSize * 128) * (size_t)bankslots_sizes[i])
            {
                SET_ERROR(WOPN_ERR_UNEXPECTED_ENDING);
                return NULL;
            }

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPNInstrument *ins = &bankslots[i][j].ins[k];
                    WOPN_parseInstrument(ins, cursor, version, 1);
                    GO_FORWARD(insSize);
                }
            }
        }
    }

#undef GO_FORWARD
#undef SET_ERROR

    return outFile;
}